

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::Approx::setMargin(Approx *this,double newMargin)

{
  string *msg;
  long in_RDI;
  double in_XMM0_Qa;
  ReusableStringStream *in_stack_ffffffffffffff78;
  ReusableStringStream *in_stack_ffffffffffffff80;
  
  if (in_XMM0_Qa < 0.0) {
    ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffff80);
    msg = (string *)
          ReusableStringStream::operator<<
                    (in_stack_ffffffffffffff80,(char (*) [25])in_stack_ffffffffffffff78);
    ReusableStringStream::operator<<(in_stack_ffffffffffffff80,(double *)in_stack_ffffffffffffff78);
    ReusableStringStream::operator<<(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
    ReusableStringStream::operator<<
              (in_stack_ffffffffffffff80,(char (*) [40])in_stack_ffffffffffffff78);
    ReusableStringStream::str_abi_cxx11_(in_stack_ffffffffffffff78);
    throw_domain_error(msg);
  }
  *(double *)(in_RDI + 8) = in_XMM0_Qa;
  return;
}

Assistant:

void Approx::setMargin(double newMargin) {
        CATCH_ENFORCE(newMargin >= 0,
            "Invalid Approx::margin: " << newMargin << '.'
            << " Approx::Margin has to be non-negative.");
        m_margin = newMargin;
    }